

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_seh.cpp
# Opt level: O0

void badCallInner_Nullptr(void)

{
  double __x;
  undefined1 local_50 [8];
  StackInfo si;
  int *ptr;
  
  si.whereTaken.str = (char *)0x0;
  nodecpp::log::default_log::info<char_const*>
            ("about to attempt to dereference a null pointer. Calling at ");
  nodecpp::StackInfo::StackInfo((StackInfo *)local_50,true);
  nodecpp::StackInfo::log((StackInfo *)local_50,__x);
  nodecpp::StackInfo::~StackInfo((StackInfo *)local_50);
  return;
}

Assistant:

void badCallInner_Nullptr()
{
	volatile int * ptr = nullptr;
#ifndef NODECPP_NO_STACK_INFO_IN_EXCEPTIONS
	nodecpp::log::default_log::info("about to attempt to dereference a null pointer. Calling at " );
	nodecpp::StackInfo si(true);
	si.log( nodecpp::log::LogLevel::fatal );
#endif // NODECPP_NO_STACK_INFO_IN_EXCEPTIONS
#if !defined NODECPP_CLANG // SEH implementation for clang is yet to be developed
    *ptr = 0;
#endif // NODECPP_CLANG
}